

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O1

char argo::utf8::to_hex(uint i)

{
  json_utf8_exception *this;
  byte bVar1;
  
  if (i < 10) {
    bVar1 = (byte)i | 0x30;
  }
  else {
    if (0xf < i) {
      this = (json_utf8_exception *)__cxa_allocate_exception(0xe0);
      json_utf8_exception::json_utf8_exception(this,invalid_hex_number_e,i);
      __cxa_throw(this,&json_utf8_exception::typeinfo,std::exception::~exception);
    }
    bVar1 = (byte)i + 0x57;
  }
  return bVar1;
}

Assistant:

char utf8::to_hex(unsigned int i)
{
    if (i <= 9)
    {
        return '0' + i;
    }
    else if (i <= 15)
    {
        return 'a' + i - 10;
    }
    else
    {
        throw json_utf8_exception(json_exception::invalid_hex_number_e, i);
    }
}